

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O2

void __thiscall ami_nvar_t::nvar_entry_body_t::_clean_up(nvar_entry_body_t *this)

{
  return;
}

Assistant:

void ami_nvar_t::nvar_entry_body_t::_clean_up() {
    if (!n_guid_index) {
    }
    if (!n_guid) {
    }
    if (!n_ascii_name) {
    }
    if (!n_ucs2_name) {
    }
    if (!n_invoke_data_start) {
    }
    if (f_extended_header_attributes && !n_extended_header_attributes) {
    }
    if (f_extended_header_size_field && !n_extended_header_size_field) {
    }
    if (f_extended_header_timestamp && !n_extended_header_timestamp) {
    }
    if (f_extended_header_checksum && !n_extended_header_checksum) {
    }
    if (f_extended_header_hash && !n_extended_header_hash) {
    }
}